

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_A_SetInvulnerable(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  char *__assertion;
  DObject *this_00;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005570d1;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_00557048:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005570d1;
        }
      }
      if (numparam == 1) goto LAB_005570b2;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_005570c1;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005570d1;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_005570c1;
      }
      if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005570b2:
        pbVar1 = (byte *)((long)&this_00[10]._vptr_DObject + 3);
        *pbVar1 = *pbVar1 | 8;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005570d1;
    }
    if (this_00 == (DObject *)0x0) goto LAB_00557048;
  }
LAB_005570c1:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005570d1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0x1e5,"int AF_A_SetInvulnerable(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetInvulnerable)
{
	PARAM_ACTION_PROLOGUE;

	self->flags2 |= MF2_INVULNERABLE;
	return 0;
}